

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O2

void psocks_sc_write_eof(SshChannel *sc)

{
  if (sc[-3].cl != (ConnectionLayer *)0x0) {
    (*(code *)((sc[-3].cl)->logctx->queue).buffersize)();
    *(undefined1 *)((long)&sc[-2].vt + 1) = 1;
    if (((ulong)sc[-6].cl[2].vt & 2) != 0) {
      psocks_conn_log((psocks_connection *)&sc[-6].cl,"send eof");
    }
    queue_toplevel_callback(psocks_check_close,&sc[-6].cl);
    return;
  }
  return;
}

Assistant:

static void psocks_sc_write_eof(SshChannel *sc)
{
    psocks_connection *conn = container_of(sc, psocks_connection, sc);
    if (!conn->socket) return;
    sk_write_eof(conn->socket);
    conn->eof_pfmgr_to_socket = true;

    if (conn->ps->log_flags & LOG_DIALOGUE)
        psocks_conn_log(conn, "send eof");

    queue_toplevel_callback(psocks_check_close, conn);
}